

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

cio_http_cb_return callback_write_response(cio_http_client *c,cio_http_status_code code)

{
  cio_http_location_handler *pcVar1;
  cio_http_cb_return cVar2;
  
  pcVar1 = c->current_handler;
  pcVar1[1].on_fragment = (cio_http_data_cb_t)"Hello World!";
  pcVar1[1].on_header_field_name = (cio_http_data_cb_t)0xd;
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)(pcVar1 + 1),(cio_write_buffer *)&pcVar1[1].on_path);
  cVar2 = (*c->write_response)(c,code,(cio_write_buffer *)(pcVar1 + 1),response_written_cb);
  return cVar2;
}

Assistant:

static enum cio_http_cb_return callback_write_response(struct cio_http_client *c, enum cio_http_status_code code)
{
	static const char data[] = "Hello World!";
	struct cio_http_location_handler *handler = c->current_handler;
	struct dummy_handler *dh = cio_container_of(handler, struct dummy_handler, handler);
	cio_write_buffer_const_element_init(&dh->wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&dh->wbh, &dh->wb);
	c->write_response(c, code, &dh->wbh, response_written_cb);
	return CIO_HTTP_CB_SUCCESS;
}